

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O1

ON_ClippingPlaneData * __thiscall
ON_ClippingPlaneDataList::AppendNew(ON_ClippingPlaneDataList *this)

{
  uint uVar1;
  ON_ClippingPlaneData *pOVar2;
  ON_ClippingPlaneData *data;
  ON_ClippingPlaneData *local_20;
  
  pOVar2 = (ON_ClippingPlaneData *)operator_new(0x50);
  pOVar2->m_sn = 0;
  pOVar2->m_depth = 0.0;
  ON_UuidList::ON_UuidList(&pOVar2->m_object_id_list,0);
  (pOVar2->m_layer_list)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008176a8;
  (pOVar2->m_layer_list).m_a = (int *)0x0;
  (pOVar2->m_layer_list).m_count = 0;
  (pOVar2->m_layer_list).m_capacity = 0;
  pOVar2->m_layer_list_is_sorted = true;
  pOVar2->m_is_exclusion_list = true;
  local_20 = pOVar2;
  ON_SimpleArray<ON_ClippingPlaneData_*>::Append(&this->m_list,&local_20);
  uVar1 = AppendNew::serial_number + 1;
  local_20->m_sn = AppendNew::serial_number;
  AppendNew::serial_number = uVar1;
  return local_20;
}

Assistant:

ON_ClippingPlaneData* ON_ClippingPlaneDataList::AppendNew()
{
  static unsigned int serial_number = 1;
  ON_ClippingPlaneData* data = new ON_ClippingPlaneData();
  m_list.Append(data);
  data->m_sn = serial_number++;
  return data;
}